

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O0

void __thiscall
ft::treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::rotateRight
          (treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *this,node *x)

{
  treeNode<int> *ptVar1;
  node *pnVar2;
  node *pnVar3;
  node *y;
  node *x_local;
  treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *this_local;
  
  ptVar1 = x->left;
  x->left = ptVar1->right;
  pnVar3 = ptVar1->right;
  pnVar2 = NIL(this);
  if (pnVar3 != pnVar2) {
    ptVar1->right->parent = x;
  }
  ptVar1->parent = x->parent;
  pnVar3 = root(this);
  if (x == pnVar3) {
    (this->m_tree).m_root = ptVar1;
  }
  else if (x == x->parent->right) {
    x->parent->right = ptVar1;
  }
  else if (x == x->parent->left) {
    x->parent->left = ptVar1;
  }
  ptVar1->right = x;
  x->parent = ptVar1;
  return;
}

Assistant:

void rotateRight(node* x)
	{
		node*	y = x->left;

		x->left = y->right;
		if (y->right != this->NIL())
			y->right->parent = x;
		y->parent = x->parent;
		if (x == this->root())
			this->m_tree.m_root = y;
		else if (x == x->parent->right)
			x->parent->right = y;
		else if (x == x->parent->left)
			x->parent->left = y;
		y->right = x;
		x->parent = y;
	}